

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_utils.cpp
# Opt level: O1

void __thiscall Potassco::RuleBuilder::startBody(RuleBuilder *this,Body_t bt,Weight_t bnd)

{
  uint uVar1;
  Weight_t *pWVar2;
  uint *puVar3;
  ulong n;
  
  puVar3 = (uint *)(this->mem_).beg_;
  if ((int)*puVar3 < 0) {
    puVar3[1] = 0;
    puVar3[2] = 0;
    puVar3[3] = 0;
    puVar3[4] = 0;
    *puVar3 = 0x14;
  }
  if (puVar3[4] == 0) {
    if (bt.val_ != Normal) {
      uVar1 = *puVar3;
      n = (ulong)(uVar1 & 0x7fffffff) + 4;
      if ((ulong)((long)(this->mem_).end_ - (long)(this->mem_).beg_) < n) {
        MemoryRegion::grow(&this->mem_,n);
        puVar3 = (uint *)(this->mem_).beg_;
      }
      pWVar2 = (Weight_t *)MemoryRegion::operator[](&this->mem_,(ulong)(uVar1 & 0x7fffffff));
      *pWVar2 = bnd;
      *puVar3 = *puVar3 & 0x80000000 | (uint)n & 0x7fffffff;
    }
    puVar3[4] = *puVar3 & 0x7fffffff;
    puVar3[3] = bt.val_ << 0x1e | *puVar3 & 0x3fffffff;
  }
  else if (puVar3[4] != (puVar3[3] & 0x3fffffff)) {
    fail(-1,"void Potassco::RuleBuilder::startBody(Body_t, Weight_t)",0x91,"r->body.len() == 0",
         "Invalid second call to startBody()",0);
  }
  return;
}

Assistant:

void RuleBuilder::startBody(Body_t bt, Weight_t bnd) {
	Rule* r = unfreeze(true);
	if (!r->body.mend) {
		if (bt != Body_t::Normal) { r = push(mem_, r, bnd); }
		r->body.init(r->top, bt);
	}
	else {
		POTASSCO_ASSERT(r->body.len() == 0, "Invalid second call to startBody()");
	}
}